

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::execution_is_branchless(Compiler *this,SPIRBlock *from,SPIRBlock *to)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  while( true ) {
    uVar1 = (from->super_IVariant).self.id;
    uVar2 = (to->super_IVariant).self.id;
    if (((uVar1 == uVar2) || (*(int *)&(from->super_IVariant).field_0xc != 1)) ||
       (from->merge != MergeNone)) break;
    from = get<spirv_cross::SPIRBlock>(this,(from->next_block).id);
  }
  return uVar1 == uVar2;
}

Assistant:

bool Compiler::execution_is_branchless(const SPIRBlock &from, const SPIRBlock &to) const
{
	auto *start = &from;
	for (;;)
	{
		if (start->self == to.self)
			return true;

		if (start->terminator == SPIRBlock::Direct && start->merge == SPIRBlock::MergeNone)
			start = &get<SPIRBlock>(start->next_block);
		else
			return false;
	}
}